

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * GetCombinedRootWindow(ImGuiWindow *window,bool popup_hierarchy)

{
  ImGuiWindow *last_window;
  bool popup_hierarchy_local;
  ImGuiWindow *window_local;
  
  last_window = (ImGuiWindow *)0x0;
  window_local = window;
  while (last_window != window_local) {
    last_window = window_local;
    window_local = window_local->RootWindow;
    if (popup_hierarchy) {
      window_local = window_local->RootWindowPopupTree;
    }
  }
  return window_local;
}

Assistant:

static ImGuiWindow* GetCombinedRootWindow(ImGuiWindow* window, bool popup_hierarchy)
{
    ImGuiWindow* last_window = NULL;
    while (last_window != window)
    {
        last_window = window;
        window = window->RootWindow;
        if (popup_hierarchy)
            window = window->RootWindowPopupTree;
    }
    return window;
}